

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimer.cpp
# Opt level: O2

Duration QTimer::from_msecs(milliseconds ms)

{
  Duration DVar1;
  long in_FS_OFFSET;
  QMessageLogger local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  DVar1.__r = ms.__r * 1000000;
  if (SEXT816(DVar1.__r) != SEXT816(ms.__r) * SEXT416(1000000)) {
    local_28.context.version = 2;
    local_28.context.function._4_4_ = 0;
    local_28.context._4_8_ = 0;
    local_28.context._12_8_ = 0;
    local_28.context.category = "default";
    QMessageLogger::warning
              (&local_28,
               "QTimer::singleShot(std::chrono::milliseconds, ...): interval argument overflowed when converted to nanoseconds."
              );
    DVar1.__r = 0x7fffffffffffffff;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (Duration)DVar1.__r;
  }
  __stack_chk_fail();
}

Assistant:

QAbstractEventDispatcher::Duration // statically asserts that Duration is nanoseconds
QTimer::from_msecs(std::chrono::milliseconds ms)
{
    using Duration = QAbstractEventDispatcher::Duration;

    using namespace std::chrono;
    using ratio = std::ratio_divide<std::milli, Duration::period>;
    static_assert(ratio::den == 1);

    Duration::rep r;
    if (qMulOverflow<ratio::num>(ms.count(), &r)) {
        qWarning("QTimer::singleShot(std::chrono::milliseconds, ...): "
                 "interval argument overflowed when converted to nanoseconds.");
        return Duration::max();
    }
    return Duration{r};
}